

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.h
# Opt level: O3

void __thiscall caldate_t::set_dayno(caldate_t *this,int32_t dayno)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  ldiv_t lVar8;
  ldiv_t lVar9;
  ldiv_t lVar10;
  
  dVar7 = floor(((double)dayno * 10000.0 + 14780.0) / 3652425.0);
  iVar5 = (int)dVar7;
  lVar6 = (long)iVar5;
  lVar8 = ldiv(lVar6,4);
  lVar9 = ldiv(lVar6,100);
  lVar10 = ldiv(lVar6,400);
  iVar2 = iVar5 * -0x16d + dayno + (-(int)lVar8.quot - (lVar8.rem._4_4_ >> 0x1f)) +
          (lVar9.rem._4_4_ >> 0x1f) + (int)lVar9.quot +
          (-(int)lVar10.quot - (lVar10.rem._4_4_ >> 0x1f));
  if (iVar2 < 0) {
    iVar5 = iVar5 + -1;
    lVar6 = (long)iVar5;
    lVar8 = ldiv(lVar6,4);
    lVar9 = ldiv(lVar6,100);
    lVar10 = ldiv(lVar6,400);
    iVar2 = iVar5 * -0x16d + dayno + (-(int)lVar8.quot - (lVar8.rem._4_4_ >> 0x1f)) +
            (-(int)lVar10.quot - (lVar10.rem._4_4_ >> 0x1f)) +
            (lVar9.rem._4_4_ >> 0x1f) + (int)lVar9.quot;
  }
  iVar3 = iVar2 * 100 + 0x34;
  iVar1 = iVar3 >> 0x1f;
  iVar3 = iVar3 / 0xbf4 + iVar1;
  iVar4 = (iVar3 - iVar1) + 2;
  this->y = iVar5 + iVar4 / 0xc;
  this->m = iVar4 % 0xc + 1;
  iVar5 = (int)((ulong)((long)((iVar3 - iVar1) * 0x132 + 5) * -0x66666667) >> 0x20);
  this->d = iVar2 + ((iVar5 >> 2) - (iVar5 >> 0x1f)) + 1;
  return;
}

Assistant:

void set_dayno(int32_t dayno)
    {
        int32_t y = (int32_t)floor((10000*(double)dayno + 14780)/3652425.0);
        int32_t d = dayno - (365*y + divfl(y, 4) - divfl(y, 100)
                             + divfl(y, 400));
        if (d < 0)
        {
            y -= 1;
            d = dayno - (365*y + divfl(y, 4) - divfl(y, 100) + divfl(y, 400));
        }
        int32_t m = (100*d + 52)/3060;

        this->y = y + (m+2)/12;
        this->m = (m + 2)%12 + 1;
        this->d = d - (m*306 + 5)/10 + 1;
    }